

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboColorTex2DArrayCase::render(FboColorTex2DArrayCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  bool bVar1;
  deUint32 dVar2;
  DataType DVar3;
  int iVar4;
  int height;
  DataTypes *samplerTypes;
  Context *pCVar5;
  TransferFormat TVar6;
  int iVar7;
  size_t n;
  ulong uVar8;
  deUint32 tex;
  deUint32 local_46c;
  deUint32 local_468;
  deUint32 tmpTex;
  TextureFormat texFmt;
  Vec3 p1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  vector<int,_std::allocator<int>_> order;
  Vector<float,_4> local_3f8;
  deUint32 layerFbo;
  Vec3 p0;
  void *local_3a0;
  Random rnd;
  TextureFormatInfo fmtInfo;
  Texture2DArrayShader arrayTexShader;
  Texture2DShader texToFboShader;
  
  dVar2 = deStringHash((this->super_FboColorbufferCase).super_FboTestCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2 ^ 0xed607a89);
  texFmt = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  arrayTexShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  arrayTexShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&arrayTexShader,TYPE_SAMPLER_2D);
  DVar3 = FboTestUtil::getFragmentOutputType(&texFmt);
  tcu::operator-((tcu *)&layerFbo,&fmtInfo.valueMax,&fmtInfo.valueMin);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,samplerTypes,DVar3,(Vec4 *)&layerFbo,&fmtInfo.valueMin);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&arrayTexShader);
  DVar3 = glu::getSampler2DArrayType(texFmt);
  FboTestUtil::Texture2DArrayShader::Texture2DArrayShader(&arrayTexShader,DVar3,TYPE_FLOAT_VEC4);
  this_00 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_46c = (*pCVar5->_vptr_Context[0x75])(pCVar5,&texToFboShader);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_468 = (*pCVar5->_vptr_Context[0x75])(pCVar5,&arrayTexShader);
  pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,pCVar5,local_46c);
  FboTestUtil::Texture2DArrayShader::setTexScaleBias
            (&arrayTexShader,&fmtInfo.lookupScale,&fmtInfo.lookupBias);
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar6 = glu::getTransferFormat(texFmt);
  bVar1 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2802,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2803,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x8072,0x812f);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2801,bVar1 | 0x2600);
  sglr::ContextWrapper::glTexParameteri(this_00,0x8c1a,0x2800,bVar1 | 0x2600);
  sglr::ContextWrapper::glTexImage3D
            (this_00,0x8c1a,0,(this->super_FboColorbufferCase).m_format,
             *(int *)&(this->super_FboColorbufferCase).field_0x8c,*(int *)&this->field_0x90,
             *(int *)&this->field_0x94,0,TVar6.format,TVar6.dataType,(void *)0x0);
  for (iVar7 = 0; iVar7 < *(int *)&this->field_0x94; iVar7 = iVar7 + 1) {
    sglr::ContextWrapper::glGenFramebuffers(this_00,1,&layerFbo);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,layerFbo);
    sglr::ContextWrapper::glFramebufferTextureLayer(this_00,0x8d40,0x8ce0,tex,0,iVar7);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&fbos,&layerFbo);
  }
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  for (uVar8 = 0;
      uVar8 < (ulong)((long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
    layerFbo = (deUint32)uVar8;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&order,(int *)&layerFbo);
  }
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&rnd,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  for (uVar8 = 0;
      uVar8 < (ulong)((long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar8 = uVar8 + 1) {
    iVar7 = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar8];
    tmpTex = 0;
    dVar2 = fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar7];
    p0.m_data._0_8_ = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)&layerFbo,(TextureFormat *)&p0,0x80,0x80,1);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&layerFbo);
    generateRandomColor((Functional *)&p1,&rnd);
    tcu::Vector<float,_4>::Vector(&local_3f8,0.0);
    tcu::fillWithGrid((PixelBufferAccess *)&p0,8,(Vec4 *)&p1,&local_3f8);
    sglr::ContextWrapper::glGenTextures(this_00,1,&tmpTex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tmpTex);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2802,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2803,0x812f);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    sglr::ContextWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2601);
    tcu::TextureLevel::getAccess((PixelBufferAccess *)&p0,(TextureLevel *)&layerFbo);
    sglr::ContextWrapper::glTexImage2D(this_00,0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,local_3a0);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,dVar2);
    sglr::ContextWrapper::glViewport
              (this_00,0,0,*(int *)&(this->super_FboColorbufferCase).field_0x8c,
               *(int *)&this->field_0x90);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    p0.m_data[0] = -1.0;
    p0.m_data[1] = -1.0;
    p0.m_data[2] = 0.0;
    p1.m_data[0] = 1.0;
    p1.m_data[1] = 1.0;
    p1.m_data[2] = 0.0;
    sglr::drawQuad(pCVar5,local_46c,&p0,&p1);
    FboTestCase::checkError((FboTestCase *)this);
    p0.m_data[1] = (float)(uVar8 >> 1) + -1.0;
    p0.m_data[0] = (float)(int)(((uint)uVar8 & 1) - 1);
    p0.m_data[2] = 0.0;
    local_3f8.m_data[0] = 1.0;
    local_3f8.m_data[1] = 1.0;
    local_3f8.m_data[2] = 0.0;
    tcu::operator+((tcu *)&p1,(Vector<float,_3> *)&p0,(Vector<float,_3> *)&local_3f8);
    sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,0);
    iVar4 = sglr::ContextWrapper::getWidth(this_00);
    height = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glViewport(this_00,0,0,iVar4,height);
    sglr::ContextWrapper::glActiveTexture(this_00,0x84c0);
    sglr::ContextWrapper::glBindTexture(this_00,0x8c1a,tex);
    FboTestUtil::Texture2DArrayShader::setLayer(&arrayTexShader,iVar7);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    FboTestUtil::Texture2DArrayShader::setUniforms(&arrayTexShader,pCVar5,local_468);
    pCVar5 = sglr::ContextWrapper::getCurrentContext(this_00);
    sglr::drawQuad(pCVar5,local_468,&p0,&p1);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)&layerFbo);
  }
  iVar7 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar7,iVar4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&order.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&fbos.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  sglr::ShaderProgram::~ShaderProgram(&arrayTexShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		de::Random				rnd					(deStringHash(getName()) ^ 0xed607a89);
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		Texture2DArrayShader	arrayTexShader		(glu::getSampler2DArrayType(texFmt), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				arrayTexShaderID	= getCurrentContext()->createProgram(&arrayTexShader);

		// Setup textures
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		arrayTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(texFmt);
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec3&			size			= m_texSize;


			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D_ARRAY,		tex);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			// Generate an FBO for each layer
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32			layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		// Render test images to random texture layers
		std::vector<int>		order;

		for (size_t n = 0; n < fbos.size(); n++)
			order.push_back((int)n);
		rnd.shuffle(order.begin(), order.end());

		for (size_t ndx = 0; ndx < order.size(); ndx++)
		{
			const int			layer		= order[ndx];
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			const deUint32		fbo			= fbos[layer];
			const IVec3&		viewport	= m_texSize;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			checkError();

			// Render to framebuffer
			{
				const Vec3		p0	= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
				const Vec3		p1	= p0 + Vec3(1.0f, 1.0f, 0.0f);

				glBindFramebuffer(GL_FRAMEBUFFER, 0);
				glViewport(0, 0, getWidth(), getHeight());

				glActiveTexture(GL_TEXTURE0);
				glBindTexture(GL_TEXTURE_2D_ARRAY, tex);

				arrayTexShader.setLayer(layer);
				arrayTexShader.setUniforms(*getCurrentContext(), arrayTexShaderID);

				sglr::drawQuad(*getCurrentContext(), arrayTexShaderID, p0, p1);
				checkError();
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}